

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O0

void * __thiscall
axl::io::MappedViewMgr::find(MappedViewMgr *this,uint64_t begin,uint64_t end,uint64_t *actualEnd)

{
  IteratorBase<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
  this_00;
  ViewEntry *key;
  void *pvVar1;
  RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> *pRVar2;
  BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
  *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
  *in_RDI;
  Iterator it;
  ViewEntry *viewEntry;
  ViewEntry *in_stack_ffffffffffffffa8;
  IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  local_40;
  IteratorBase<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
  it_00;
  void *local_8;
  
  this_00.m_p = (Entry *)sl::
                         ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
                         ::getHead((ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
                                    *)in_stack_ffffffffffffffa8);
  key = sl::
        IteratorImpl<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
        ::operator*((IteratorImpl<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
                     *)&stack0xffffffffffffffc8);
  if (key == (ViewEntry *)0x0) {
    local_8 = (void *)0x0;
  }
  else if ((in_RSI < key->m_begin) || (key->m_end < in_RDX)) {
    local_40.
    super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
    .m_p = (IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
            )sl::
             BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
             ::find<(axl::sl::RelOpKind)3>(in_RCX,(unsigned_long)key);
    pvVar1 = sl::IteratorBase::operator_cast_to_void_((IteratorBase *)&local_40);
    if (pvVar1 == (void *)0x0) {
      local_8 = (void *)0x0;
    }
    else {
      pRVar2 = sl::
               IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
               ::operator->(&local_40);
      it_00.m_p = (pRVar2->
                  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
                  ).super_MapEntry<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>.m_value;
      if ((it_00.m_p)->m_end < in_RDX) {
        local_8 = (void *)0x0;
      }
      else {
        sl::
        Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
        ::Iterator(in_RDI,in_stack_ffffffffffffffa8);
        sl::
        ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
        ::moveToHead((ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
                      *)this_00.m_p,(Iterator)it_00.m_p);
        (in_RCX->m_nodeList).
        super_OwningListBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>_>_>
        .
        super_ListBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>_>
        .super_ListData<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>_>.
        m_head = *(RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> **)
                  ((long)it_00.m_p + 0x28);
        local_8 = psx::Mapping::operator_cast_to_void_((Mapping *)((long)it_00.m_p + 0x10));
        local_8 = (void *)((long)local_8 + (in_RSI - (it_00.m_p)->m_begin));
      }
    }
  }
  else {
    (in_RCX->m_nodeList).
    super_OwningListBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>_>_>
    .
    super_ListBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>_>
    .super_ListData<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>_>.m_head
         = (RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> *)key->m_end;
    local_8 = psx::Mapping::operator_cast_to_void_(&key->m_view);
    local_8 = (void *)((long)local_8 + (in_RSI - key->m_begin));
  }
  return local_8;
}

Assistant:

void*
MappedViewMgr::find(
	uint64_t begin,
	uint64_t end,
	uint64_t* actualEnd
) {
	// first check the last view

	ViewEntry* viewEntry = *m_viewList.getHead();
	if (!viewEntry)
		return NULL;

	if (viewEntry->m_begin <= begin && viewEntry->m_end >= end) {
		*actualEnd = viewEntry->m_end;
		return (char*)(void*)viewEntry->m_view + begin - viewEntry->m_begin;
	}

	// ok, now try to find existing view using the view map...

	ViewMap::Iterator it = m_viewMap.find<sl::RelOpKind_Le>(begin);
	if (!it)
		return NULL;

	viewEntry = it->m_value;
	if (viewEntry->m_end < end)
		return NULL;

	// ok, this view covers it.
	// move it to the head to mark as recently used and return

	m_viewList.moveToHead(viewEntry);
	*actualEnd = viewEntry->m_end;
	return (char*)(void*)viewEntry->m_view + begin - viewEntry->m_begin;
}